

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSubscribe(HelicsEndpoint endpoint,char *key,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t sVar2;
  string_view key_00;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    if (key == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      this = pEVar1->endPtr;
      sVar2 = strlen(key);
      key_00._M_str = key;
      key_00._M_len = sVar2;
      helics::Endpoint::subscribe(this,key_00);
    }
  }
  return;
}

Assistant:

void helicsEndpointSubscribe(HelicsEndpoint endpoint, const char* key, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(key, void());
    try {
        endObj->endPtr->subscribe(key);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}